

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O0

nfa_state_t * __thiscall re2c::RuleOp::compile(RuleOp *this,nfa_t *nfa,nfa_state_t *param_2)

{
  uint uVar1;
  int iVar2;
  nfa_state_t *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  nfa_state_t *s1;
  nfa_state_t *s2;
  nfa_state_t *s3;
  nfa_state_t *param_2_local;
  nfa_t *nfa_local;
  RuleOp *this_local;
  
  uVar1 = nfa->size;
  nfa->size = uVar1 + 1;
  this_00 = nfa->states + uVar1;
  nfa_state_t::fin(this_00,this);
  iVar2 = (*this->ctx->_vptr_RegExp[3])();
  s2 = this_00;
  if (iVar2 != 0) {
    uVar1 = nfa->size;
    nfa->size = uVar1 + 1;
    s2 = nfa->states + uVar1;
    iVar2 = (*this->ctx->_vptr_RegExp[5])(this->ctx,nfa,this_00);
    nfa_state_t::ctx(s2,(nfa_state_t *)CONCAT44(extraout_var,iVar2));
  }
  iVar2 = (*this->exp->_vptr_RegExp[5])(this->exp,nfa,s2);
  return (nfa_state_t *)CONCAT44(extraout_var_00,iVar2);
}

Assistant:

nfa_state_t *RuleOp::compile(nfa_t &nfa, nfa_state_t *)
{
	nfa_state_t *s3 = &nfa.states[nfa.size++];
	s3->fin(this);
	if (ctx->calc_size() > 0)
	{
		nfa_state_t *s2 = &nfa.states[nfa.size++];
		s2->ctx(ctx->compile(nfa, s3));
		s3 = s2;
	}
	nfa_state_t *s1 = exp->compile(nfa, s3);
	return s1;
}